

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

void __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
::Node(void *param_1,undefined8 *param_2,int64_t param_3)

{
  undefined8 uVar1;
  Node<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  *in_stack_ffffffffffffffd0;
  
  *(undefined8 *)((long)param_1 + 0x10) = param_2[2];
  uVar1 = param_2[1];
  *(undefined8 *)param_1 = *param_2;
  *(undefined8 *)((long)param_1 + 8) = uVar1;
  SwappableNodeRefStack<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
  ::SwappableNodeRefStack
            ((SwappableNodeRefStack<std::pair<unsigned_long,_duckdb::hugeint_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::hugeint_t>_>_>
              *)((long)param_1 + 0x18));
  (((pair<unsigned_long,_duckdb::hugeint_t> *)((long)param_1 + 0x30))->second).upper = param_3;
  Initialize(in_stack_ffffffffffffffd0,(pair<unsigned_long,_duckdb::hugeint_t> *)param_1);
  return;
}

Assistant:

Node<T, _Compare>::Node(const T &value, _Compare _cmp, _Pool &pool) : \
    _value(value), _compare(_cmp), _pool(pool) {
    Initialize(value);
}